

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopCreate(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nVars,Vec_Int_t *vMemory)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int i;
  
  cResult->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,vInput->nSize);
  cResult->pCubes = puVar3;
  for (i = 0; i < vInput->nSize; i = i + 1) {
    uVar2 = Vec_IntEntry(vInput,i);
    iVar1 = cResult->nCubes;
    cResult->nCubes = iVar1 + 1;
    cResult->pCubes[iVar1] = uVar2;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates SOP from the cube array.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_SopCreate( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nVars, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Vec_IntSize(vInput) );
    // add the cubes
    Vec_IntForEachEntry( vInput, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}